

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O0

void __thiscall libtorrent::dht::dht_tracker::update_stats_counters(dht_tracker *this,counters *c)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  reference ppVar3;
  pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node> *n;
  const_iterator __end2;
  const_iterator __begin2;
  tracker_nodes_t *__range2;
  tracker_nodes_t **local_20;
  dht_storage_counters *dht_cnt;
  counters *c_local;
  dht_tracker *this_local;
  
  dht_cnt = (dht_storage_counters *)c;
  c_local = (counters *)this;
  iVar2 = (*this->m_storage->_vptr_dht_storage_interface[10])();
  __range2 = (tracker_nodes_t *)CONCAT44(extraout_var,iVar2);
  local_20 = &__range2;
  counters::set_value((counters *)dht_cnt,0x111,(long)iVar2);
  counters::set_value((counters *)dht_cnt,0x112,(long)*(int *)((long)local_20 + 4));
  counters::set_value((counters *)dht_cnt,0x113,(long)*(int *)(local_20 + 1));
  counters::set_value((counters *)dht_cnt,0x114,(long)*(int *)((long)local_20 + 0xc));
  counters::set_value((counters *)dht_cnt,0x10f,0);
  counters::set_value((counters *)dht_cnt,0x110,0);
  counters::set_value((counters *)dht_cnt,0x115,0);
  __end2 = ::std::
           map<libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node,_std::less<libtorrent::aux::listen_socket_handle>,_std::allocator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>_>
           ::begin(&this->m_nodes);
  n = (pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>
       *)::std::
         map<libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node,_std::less<libtorrent::aux::listen_socket_handle>,_std::allocator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>_>
         ::end(&this->m_nodes);
  while( true ) {
    bVar1 = ::std::operator!=(&__end2,(_Self *)&n);
    if (!bVar1) break;
    ppVar3 = ::std::
             _Rb_tree_const_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
             ::operator*(&__end2);
    anon_unknown_20::add_dht_counters(&(ppVar3->second).dht,(counters *)dht_cnt);
    ::std::
    _Rb_tree_const_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void dht_tracker::update_stats_counters(counters& c) const
	{
		const dht_storage_counters& dht_cnt = m_storage.counters();
		c.set_value(counters::dht_torrents, dht_cnt.torrents);
		c.set_value(counters::dht_peers, dht_cnt.peers);
		c.set_value(counters::dht_immutable_data, dht_cnt.immutable_data);
		c.set_value(counters::dht_mutable_data, dht_cnt.mutable_data);

		c.set_value(counters::dht_nodes, 0);
		c.set_value(counters::dht_node_cache, 0);
		c.set_value(counters::dht_allocated_observers, 0);

		for (auto const& n : m_nodes)
			add_dht_counters(n.second.dht, c);
	}